

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populateOptions
          (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  string *shortName;
  value_type *__x;
  pointer pAVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  bool bVar3;
  bool bVar4;
  pointer pTVar5;
  domain_error *this_00;
  ulong uVar6;
  pointer this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [5];
  
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar5 = (tokens->super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((tokens->super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>).
      _M_impl.super__Vector_impl_data._M_finish != pTVar5) {
    uVar6 = 0;
    do {
      __x = pTVar5 + uVar6;
      this_01 = (this->m_options).
                super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar1 = (this->m_options).
               super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_01 != pAVar1) {
        shortName = &__x->data;
        do {
          if (__x->type == ShortOpt) {
            bVar3 = Arg::hasShortName(this_01,shortName);
            if (!bVar3) goto LAB_001383a1;
LAB_001383bd:
            if ((this_01->hint)._M_string_length == 0) {
              pIVar2 = (this_01->boundField).functionObj;
              (*pIVar2->_vptr_IArgFunction[3])(pIVar2,config);
            }
            else {
              pTVar5 = (tokens->
                       super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (uVar6 == ((long)(tokens->
                                  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3) *
                           -0x3333333333333333 - 1U) {
LAB_0013849d:
                this_00 = (domain_error *)__cxa_allocate_exception(0x10);
                std::operator+(local_d0,"Expected argument to option ",shortName);
                std::domain_error::domain_error(this_00,(string *)local_d0);
                __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
              }
              uVar6 = uVar6 + 1;
              if (pTVar5[uVar6].type != Positional) goto LAB_0013849d;
              pIVar2 = (this_01->boundField).functionObj;
              (*pIVar2->_vptr_IArgFunction[2])(pIVar2,config,&pTVar5[uVar6].data);
            }
            bVar3 = false;
          }
          else {
LAB_001383a1:
            bVar3 = true;
            if (__x->type == LongOpt) {
              bVar4 = Arg::hasLongName(this_01,shortName);
              if (bVar4) goto LAB_001383bd;
            }
          }
        } while ((bVar3) && (this_01 = this_01 + 1, this_01 != pAVar1));
      }
      if (this_01 == pAVar1) {
        std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::push_back
                  (__return_storage_ptr__,__x);
      }
      uVar6 = uVar6 + 1;
      pTVar5 = (tokens->
               super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)(((long)(tokens->
                                    super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3)
                            * -0x3333333333333333));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populateOptions( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::vector<Arg>::const_iterator it = m_options.begin(), itEnd = m_options.end();
                for(; it != itEnd; ++it ) {
                    Arg const& arg = *it;

                    try {
                        if( ( token.type == Parser::Token::ShortOpt && arg.hasShortName( token.data ) ) ||
                            ( token.type == Parser::Token::LongOpt && arg.hasLongName( token.data ) ) ) {
                            if( arg.takesArg() ) {
                                if( i == tokens.size()-1 || tokens[i+1].type != Parser::Token::Positional )
                                    throw std::domain_error( "Expected argument to option " + token.data );
                                arg.boundField.set( config, tokens[++i].data );
                            }
                            else {
                                arg.boundField.setFlag( config );
                            }
                            break;
                        }
                    }
                    catch( std::exception& ex ) {
                        throw std::runtime_error( std::string( ex.what() ) + "\n- while parsing: (" + arg.commands() + ")" );
                    }
                }
                if( it == itEnd )
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }